

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileExecutableTargetGenerator::WriteNvidiaDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *targetOutput)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmState *pcVar1;
  char **ppcVar2;
  bool linkScriptShell;
  cmGeneratorTarget *pcVar3;
  cmLocalUnixMakefileGenerator3 *pcVar4;
  cmMakefile *this_01;
  long *plVar5;
  bool useResponseFile;
  bool forResponse;
  cmLinkLineComputer *this_02;
  string *psVar6;
  string *relDir;
  char *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *real_link_command;
  pointer pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer pbVar9;
  pointer pbVar10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view source;
  string_view source_00;
  string_view source_01;
  undefined1 local_440 [24];
  undefined1 local_428 [8];
  pointer local_420;
  undefined8 local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string local_3f0;
  undefined1 *local_3d0;
  undefined8 local_3c8;
  string linkLanguage;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  string launcher;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmList real_link_commands;
  string buildObjs;
  string linkLibs;
  string linkFlags;
  string linkRuleVar;
  string langFlags;
  string objectDir;
  string ignored_;
  string val;
  string targetFullPathCompilePDB;
  string targetOutPathCompilePDB;
  string target;
  string linkRule;
  RuleVariables vars;
  
  linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,"CUDA","");
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefileTargetGenerator::AppendLinkDepends
            (&this->super_cmMakefileTargetGenerator,&depends,&linkLanguage);
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  langFlags.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)&vars,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar4,&langFlags,pcVar3,&linkLanguage,(string *)&vars);
  ppcVar2 = &vars.TargetPDB;
  if ((char **)vars.CMTargetName != ppcVar2) {
    operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
  }
  exeCleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  exeCleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  exeCleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)&vars,
             (cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
             targetOutput);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&exeCleanFiles,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
  if ((char **)vars.CMTargetName != ppcVar2) {
    operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
  }
  linkScriptShell =
       (((this->super_cmMakefileTargetGenerator).GlobalGenerator)->super_cmGlobalCommonGenerator).
       super_cmGlobalGenerator.UseLinkScript;
  linkRuleVar._M_dataplus._M_p = (pointer)&linkRuleVar.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&linkRuleVar,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE","");
  cmMakefileTargetGenerator::GetLinkRule
            (&linkRule,&this->super_cmMakefileTargetGenerator,&linkRuleVar);
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmList::cmList(&real_link_commands,&linkRule,Yes,No);
  useResponseFile =
       cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                 (&this->super_cmMakefileTargetGenerator,&linkLanguage);
  forResponse = cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                          (&this->super_cmMakefileTargetGenerator,&linkLanguage);
  cmOutputConverter::SetLinkScriptShell
            ((cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
             linkScriptShell);
  this_02 = (cmLinkLineComputer *)operator_new(0x40);
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)local_440,(cmLocalGenerator *)pcVar4);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&vars,(cmStateSnapshot *)local_440);
  cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
            ((cmLinkLineDeviceComputer *)this_02,(cmOutputConverter *)pcVar4,
             (cmStateDirectory *)&vars);
  cmLinkLineComputer::SetForResponse(this_02,forResponse);
  cmLinkLineComputer::SetRelink(this_02,relink);
  linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
  linkFlags._M_string_length = 0;
  linkFlags.field_2._M_local_buf[0] = '\0';
  ignored_._M_dataplus._M_p = (pointer)&ignored_.field_2;
  ignored_._M_string_length = 0;
  ignored_.field_2._M_local_buf[0] = '\0';
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)&vars,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar4,(cmLinkLineDeviceComputer *)this_02,(string *)&vars,
             &ignored_,&linkFlags,&ignored_,&ignored_,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  if ((char **)vars.CMTargetName != ppcVar2) {
    operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
  }
  linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
  linkLibs._M_string_length = 0;
  linkLibs.field_2._M_local_buf[0] = '\0';
  cmMakefileTargetGenerator::CreateLinkLibs
            (&this->super_cmMakefileTargetGenerator,this_02,&linkLibs,forResponse,&depends,
             &linkLanguage,DeviceLink);
  buildObjs._M_dataplus._M_p = (pointer)&buildObjs.field_2;
  buildObjs._M_string_length = 0;
  buildObjs.field_2._M_local_buf[0] = '\0';
  cmMakefileTargetGenerator::CreateObjectLists
            (&this->super_cmMakefileTargetGenerator,linkScriptShell,false,useResponseFile,&buildObjs
             ,&depends,false,&linkLanguage,DeviceLink);
  memset(&vars,0,0x158);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&objectDir,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir(&local_3f0,(cmOutputConverter *)pcVar4,&objectDir);
  source._M_str = local_3f0._M_dataplus._M_p;
  source._M_len = local_3f0._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)local_440,(cmOutputConverter *)pcVar4,source,SHELL,false);
  std::__cxx11::string::operator=((string *)&objectDir,(string *)local_440);
  pcVar1 = (cmState *)(local_440 + 0x10);
  if ((cmState *)local_440._0_8_ != pcVar1) {
    operator_delete((void *)local_440._0_8_,(ulong)(local_440._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)local_440,(cmOutputConverter *)pcVar4,targetOutput);
  source_00._M_str = (char *)local_440._0_8_;
  source_00._M_len = local_440._8_8_;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&target,(cmOutputConverter *)pcVar4,source_00,SHELL,false);
  if ((cmState *)local_440._0_8_ != pcVar1) {
    operator_delete((void *)local_440._0_8_,(ulong)(local_440._16_8_ + 1));
  }
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)local_440,&this->super_cmMakefileTargetGenerator);
  cmCommonTargetGenerator::ComputeTargetCompilePDB
            (&targetFullPathCompilePDB,(cmCommonTargetGenerator *)this,(string *)local_440);
  if ((cmState *)local_440._0_8_ != pcVar1) {
    operator_delete((void *)local_440._0_8_,(ulong)(local_440._16_8_ + 1));
  }
  source_01._M_str = targetFullPathCompilePDB._M_dataplus._M_p;
  source_01._M_len = targetFullPathCompilePDB._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&targetOutPathCompilePDB,
             (cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,source_01,
             SHELL,false);
  vars.Language = linkLanguage._M_dataplus._M_p;
  vars.Objects = buildObjs._M_dataplus._M_p;
  vars.ObjectDir = objectDir._M_dataplus._M_p;
  vars.Target = target._M_dataplus._M_p;
  vars.LinkLibraries = linkLibs._M_dataplus._M_p;
  vars.LanguageCompileFlags = langFlags._M_dataplus._M_p;
  vars.LinkFlags = linkFlags._M_dataplus._M_p;
  vars.TargetCompilePDB = targetOutPathCompilePDB._M_dataplus._M_p;
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  launcher.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_440._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"RULE_LAUNCH_LINK","");
  this_01 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"CMAKE_BUILD_TYPE","");
  psVar6 = cmMakefile::GetSafeDefinition(this_01,&local_3f0);
  cmLocalGenerator::GetRuleLauncher
            (&val,(cmLocalGenerator *)pcVar4,pcVar3,(string *)local_440,psVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((cmState *)local_440._0_8_ != pcVar1) {
    operator_delete((void *)local_440._0_8_,(ulong)(local_440._16_8_ + 1));
  }
  if (val._M_string_length != 0) {
    local_3f0._M_dataplus._M_p = (pointer)val._M_string_length;
    local_3f0._M_string_length = (size_type)val._M_dataplus._M_p;
    local_3f0.field_2._M_allocated_capacity = 0;
    local_440._16_8_ = local_428;
    local_440._0_8_ = (cmState *)0x0;
    local_440._8_8_ = &DAT_00000001;
    local_428[0] = 0x20;
    local_3f0.field_2._8_8_ = 1;
    local_3c8 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_3f0;
    local_3d0 = (undefined1 *)local_440._16_8_;
    cmCatViews((string *)&rulePlaceholderExpander,views);
    std::__cxx11::string::operator=((string *)&launcher,(string *)&rulePlaceholderExpander);
    if (rulePlaceholderExpander._M_t.
        super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
        .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl !=
        (__uniq_ptr_data<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>,_true,_true>
         )&local_388) {
      operator_delete((void *)rulePlaceholderExpander._M_t.
                              super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                              .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>.
                              _M_head_impl,local_388._M_allocated_capacity + 1);
    }
  }
  (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
    super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])
            (&rulePlaceholderExpander);
  std::__cxx11::string::_M_assign
            ((string *)
             ((long)rulePlaceholderExpander._M_t.
                    super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 8));
  if (real_link_commands.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      real_link_commands.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar7 = real_link_commands.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_440._0_8_ = launcher._M_string_length;
      local_440._8_8_ = launcher._M_dataplus._M_p;
      local_440._16_8_ = (undefined1 *)0x0;
      local_420 = (pbVar7->_M_dataplus)._M_p;
      local_428 = (undefined1  [8])pbVar7->_M_string_length;
      local_418 = 0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_440;
      cmCatViews(&local_3f0,views_00);
      std::__cxx11::string::operator=((string *)pbVar7,(string *)&local_3f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                ((cmRulePlaceholderExpander *)
                 rulePlaceholderExpander._M_t.
                 super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,
                 (cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,pbVar7,
                 &vars);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != real_link_commands.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmOutputConverter::SetLinkScriptShell
            ((cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,false);
  if ((__uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>)
      rulePlaceholderExpander._M_t.
      super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
      .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>)
      0x0) {
    (**(code **)(*(long *)rulePlaceholderExpander._M_t.
                          super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                          .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl +
                8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)val._M_dataplus._M_p != &val.field_2) {
    operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)launcher._M_dataplus._M_p != &launcher.field_2) {
    operator_delete(launcher._M_dataplus._M_p,
                    CONCAT71(launcher.field_2._M_allocated_capacity._1_7_,
                             launcher.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutPathCompilePDB._M_dataplus._M_p != &targetOutPathCompilePDB.field_2) {
    operator_delete(targetOutPathCompilePDB._M_dataplus._M_p,
                    targetOutPathCompilePDB.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetFullPathCompilePDB._M_dataplus._M_p != &targetFullPathCompilePDB.field_2) {
    operator_delete(targetFullPathCompilePDB._M_dataplus._M_p,
                    targetFullPathCompilePDB.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)target._M_dataplus._M_p != &target.field_2) {
    operator_delete(target._M_dataplus._M_p,target.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
    operator_delete(objectDir._M_dataplus._M_p,objectDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buildObjs._M_dataplus._M_p != &buildObjs.field_2) {
    operator_delete(buildObjs._M_dataplus._M_p,
                    CONCAT71(buildObjs.field_2._M_allocated_capacity._1_7_,
                             buildObjs.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
    operator_delete(linkLibs._M_dataplus._M_p,
                    CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                             linkLibs.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ignored_._M_dataplus._M_p != &ignored_.field_2) {
    operator_delete(ignored_._M_dataplus._M_p,
                    CONCAT71(ignored_.field_2._M_allocated_capacity._1_7_,
                             ignored_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
    operator_delete(linkFlags._M_dataplus._M_p,
                    CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                             linkFlags.field_2._M_local_buf[0]) + 1);
  }
  (*this_02->_vptr_cmLinkLineComputer[1])(this_02);
  if (linkScriptShell == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&commands1,&real_link_commands.Values);
  }
  else {
    name = "dlink.txt";
    if (relink) {
      name = "drelink.txt";
    }
    cmMakefileTargetGenerator::CreateLinkScript
              (&this->super_cmMakefileTargetGenerator,name,&real_link_commands.Values,&commands1,
               &depends);
  }
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile
                     );
  relDir = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::CreateCDCommand(pcVar4,&commands1,psVar6,relDir);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
             (commands->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             commands1.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             commands1.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pbVar10 = commands1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar7 = commands1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar8 = &(commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar5 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (paVar8 + -1))->_M_dataplus)._M_p;
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar5) {
        operator_delete(plVar5,paVar8->_M_allocated_capacity + 1);
      }
      pbVar9 = (pointer)(paVar8 + 1);
      paVar8 = paVar8 + 2;
    } while (pbVar9 != pbVar10);
    commands1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar7;
  }
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            ((this->super_cmMakefileTargetGenerator).LocalGenerator,
             (ostream *)
             (this->super_cmMakefileTargetGenerator).BuildFileStream._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,(char *)0x0,
             targetOutput,&depends,commands,false,false);
  pbVar7 = exeCleanFiles.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &(this->super_cmMakefileTargetGenerator).CleanFiles;
  vars.CMTargetName = (char *)this_00;
  if (exeCleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      exeCleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar10 = exeCleanFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,
                 (const_iterator)
                 &(this->super_cmMakefileTargetGenerator).CleanFiles._M_t._M_impl.
                  super__Rb_tree_header,pbVar10,(_Alloc_node *)&vars);
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar7);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&real_link_commands.Values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkRule._M_dataplus._M_p != &linkRule.field_2) {
    operator_delete(linkRule._M_dataplus._M_p,linkRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkRuleVar._M_dataplus._M_p != &linkRuleVar.field_2) {
    operator_delete(linkRuleVar._M_dataplus._M_p,linkRuleVar.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&exeCleanFiles);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)langFlags._M_dataplus._M_p != &langFlags.field_2) {
    operator_delete(langFlags._M_dataplus._M_p,
                    CONCAT71(langFlags.field_2._M_allocated_capacity._1_7_,
                             langFlags.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
    operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteNvidiaDeviceExecutableRule(
  bool relink, std::vector<std::string>& commands,
  const std::string& targetOutput)
{
  const std::string linkLanguage = "CUDA";

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Add language feature flags.
  std::string langFlags;
  this->LocalGenerator->AddLanguageFlagsForLinking(
    langFlags, this->GeneratorTarget, linkLanguage, this->GetConfigName());

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(
    this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  const std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE";
  const std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmList real_link_commands(linkRule);

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  // Expand the rule variables.
  {
    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    std::unique_ptr<cmLinkLineDeviceComputer> linkLineComputer(
      new cmLinkLineDeviceComputer(
        this->LocalGenerator,
        this->LocalGenerator->GetStateSnapshot().GetDirectory()));
    linkLineComputer->SetForResponse(useResponseFileForLibs);
    linkLineComputer->SetRelink(relink);

    // Create set of linking flags.
    std::string linkFlags;
    std::string ignored_;
    this->LocalGenerator->GetDeviceLinkFlags(
      *linkLineComputer, this->GetConfigName(), ignored_, linkFlags, ignored_,
      ignored_, this->GeneratorTarget);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    this->CreateLinkLibs(
      linkLineComputer.get(), linkLibs, useResponseFileForLibs, depends,
      linkLanguage, cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(
      useLinkScript, false, useResponseFileForObjects, buildObjs, depends,
      false, linkLanguage,
      cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    cmRulePlaceholderExpander::RuleVariables vars;
    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();

    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(objectDir),
      cmOutputConverter::SHELL);

    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput),
      cmOutputConverter::SHELL);

    std::string targetFullPathCompilePDB =
      this->ComputeTargetCompilePDB(this->GetConfigName());
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Language = linkLanguage.c_str();
    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.LanguageCompileFlags = langFlags.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    std::string launcher;

    std::string val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK",
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->LocalGenerator->CreateRulePlaceholderExpander();

    // Expand placeholders in the commands.
    rulePlaceholderExpander->SetTargetImpLib(targetOutput);
    for (auto& real_link_command : real_link_commands) {
      real_link_command = cmStrCat(launcher, real_link_command);
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }

    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  cm::append(commands, commands1);
  commands1.clear();

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      targetOutput, depends, commands, false);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(exeCleanFiles.begin(), exeCleanFiles.end());
}